

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

int __thiscall icu_63::FixedDecimal::init(FixedDecimal *this,EVP_PKEY_CTX *ctx)

{
  UBool UVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long in_RDX;
  int32_t iVar5;
  double in_XMM0_Qa;
  
  this->isNegative = in_XMM0_Qa < 0.0;
  iVar5 = (int32_t)ctx;
  this->source = ABS(in_XMM0_Qa);
  UVar1 = uprv_isNaN_63(ABS(in_XMM0_Qa));
  this->_isNaN = UVar1;
  UVar1 = uprv_isInfinite_63(this->source);
  this->_isInfinite = UVar1;
  if (UVar1 == '\0' && this->_isNaN == '\0') {
    lVar3 = (long)this->source;
    this->intValue = lVar3;
    uVar2 = -(uint)((double)lVar3 == this->source) & 1;
  }
  else {
    this->intValue = 0;
    uVar2 = 0;
    iVar5 = 0;
    in_RDX = 0;
  }
  this->_hasIntegerValue = (UBool)uVar2;
  this->visibleDecimalDigitCount = iVar5;
  this->decimalDigits = in_RDX;
  if (in_RDX == 0) {
    in_RDX = 0;
  }
  else {
    uVar4 = in_RDX * -0x3333333333333333 + 0x1999999999999998;
    for (uVar4 = uVar4 >> 1 | (ulong)((uVar4 & 1) != 0) << 0x3f; uVar2 = (uint)uVar4,
        uVar4 < 0x1999999999999999; uVar4 = uVar4 >> 1 | (ulong)((uVar4 & 1) != 0) << 0x3f) {
      in_RDX = in_RDX / 10;
      uVar4 = in_RDX * -0x3333333333333333 + 0x1999999999999998;
    }
  }
  this->decimalDigitsWithoutTrailingZeros = in_RDX;
  return uVar2;
}

Assistant:

void FixedDecimal::init(double n, int32_t v, int64_t f) {
    isNegative = n < 0.0;
    source = fabs(n);
    _isNaN = uprv_isNaN(source);
    _isInfinite = uprv_isInfinite(source);
    if (_isNaN || _isInfinite) {
        v = 0;
        f = 0;
        intValue = 0;
        _hasIntegerValue = FALSE;
    } else {
        intValue = (int64_t)source;
        _hasIntegerValue = (source == intValue);
    }

    visibleDecimalDigitCount = v;
    decimalDigits = f;
    if (f == 0) {
         decimalDigitsWithoutTrailingZeros = 0;
    } else {
        int64_t fdwtz = f;
        while ((fdwtz%10) == 0) {
            fdwtz /= 10;
        }
        decimalDigitsWithoutTrailingZeros = fdwtz;
    }
}